

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::EOR_ZP_X(CPU *this)

{
  byte bVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  
  this->cycles = 4;
  uVar2 = GetByte(this);
  this->cycles = this->cycles - 1;
  bVar3 = ReadByte(this,(ushort)(byte)(uVar2 + this->X));
  bVar1 = this->A;
  bVar4 = bVar1 ^ bVar3;
  this->A = bVar4;
  (this->field_6).ps = bVar4 & 0x80 | (bVar1 == bVar3) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::EOR_ZP_X()
{
    cycles = 4;
    uint8_t data = GetByte();
    data += X;
    cycles--;
    A ^= ReadByte(data);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}